

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.h
# Opt level: O0

TProb<double> * __thiscall libDAI::TProb<double>::sgn(TProb<double> *this)

{
  vector<double,_std::allocator<double>_> *this_00;
  value_type_conflict3 *__x;
  const_reference pvVar1;
  vector<double,_std::allocator<double>_> *in_RSI;
  TProb<double> *in_RDI;
  double s;
  size_t i;
  TProb<double> *x;
  TProb<double> *in_stack_ffffffffffffff90;
  value_type_conflict3 *pvVar2;
  TProb<double> *this_01;
  value_type_conflict3 *local_30;
  
  this_01 = in_RDI;
  TProb(in_stack_ffffffffffffff90);
  this_00 = (vector<double,_std::allocator<double>_> *)size((TProb<double> *)0xb1ba13);
  std::vector<double,_std::allocator<double>_>::reserve(this_00,(size_type)in_RDI);
  local_30 = (value_type_conflict3 *)0x0;
  while (pvVar2 = local_30, __x = (value_type_conflict3 *)size((TProb<double> *)0xb1ba48),
        pvVar2 < __x) {
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(size_type)local_30);
    if (*pvVar1 <= 0.0) {
      std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(size_type)local_30);
    }
    std::vector<double,_std::allocator<double>_>::push_back(&this_01->_p,__x);
    local_30 = (value_type_conflict3 *)((long)local_30 + 1);
  }
  return this_01;
}

Assistant:

TProb<T> sgn() const {
                TProb<T> x;
                x._p.reserve( size() );
                for( size_t i = 0; i < size(); i++ ) {
                    T s = 0;
                    if( _p[i] > 0 )
                        s = 1;
                    else if( _p[i] < 0 )
                        s = -1;
                    x._p.push_back( s );
                }
                return x;
            }